

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t sysbvm_type_decayReceiver(sysbvm_context_t *context,sysbvm_tuple_t type)

{
  sysbvm_context_t *tuple;
  _Bool _Var1;
  sysbvm_tuple_t baseType;
  sysbvm_tuple_t type_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isKindOf(context,type,(context->roots).referenceType);
  context_local = (sysbvm_context_t *)type;
  if (_Var1) {
    tuple = *(sysbvm_context_t **)(type + 0xf8);
    _Var1 = sysbvm_tuple_isKindOf(context,(sysbvm_tuple_t)tuple,(context->roots).valueType);
    if (((!_Var1) ||
        (_Var1 = sysbvm_tuple_isKindOf
                           (context,(sysbvm_tuple_t)tuple,(context->roots).primitiveValueType),
        _Var1)) ||
       (_Var1 = sysbvm_tuple_isKindOf
                          (context,(sysbvm_tuple_t)tuple,(context->roots).pointerLikeType), !_Var1))
    {
      context_local = tuple;
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_decayReceiver(sysbvm_context_t *context, sysbvm_tuple_t type)
{
    if(sysbvm_tuple_isKindOf(context, type, context->roots.referenceType))
    {
        sysbvm_tuple_t baseType = ((sysbvm_referenceType_t*)type)->super.baseType;
        if(sysbvm_tuple_isKindOf(context, baseType, context->roots.valueType) &&
            !sysbvm_tuple_isKindOf(context, baseType, context->roots.primitiveValueType) && !
            !sysbvm_tuple_isKindOf(context, baseType, context->roots.pointerLikeType))
            return type;
        return baseType;
    }

    return type;
}